

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_lightning.cpp
# Opt level: O2

void __thiscall DLightningThinker::Serialize(DLightningThinker *this,FArchive *arc)

{
  FArchive *pFVar1;
  WORD *w;
  ulong uVar2;
  ulong uVar3;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->Stopped);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->NextLightningFlash);
  FArchive::operator<<(pFVar1,(DWORD *)&this->LightningFlashCount);
  w = (WORD *)this->LightningLightLevels;
  if (arc->m_Loading == false) {
    uVar3 = (ulong)(uint)numsectors;
  }
  else {
    if (w != (WORD *)0x0) {
      operator_delete__(w);
    }
    uVar3 = (ulong)numsectors;
    uVar2 = 0xffffffffffffffff;
    if (-1 < (long)uVar3) {
      uVar2 = uVar3 * 2;
    }
    w = (WORD *)operator_new__(uVar2);
    this->LightningLightLevels = (short *)w;
  }
  for (; 0 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    FArchive::operator<<(arc,w);
    w = w + 1;
  }
  return;
}

Assistant:

void DLightningThinker::Serialize (FArchive &arc)
{
	int i;
	short *lights;

	Super::Serialize (arc);

	arc << Stopped << NextLightningFlash << LightningFlashCount;

	if (arc.IsLoading ())
	{
		if (LightningLightLevels != NULL)
		{
			delete[] LightningLightLevels;
		}
		LightningLightLevels = new short[numsectors];
	}
	lights = LightningLightLevels;
	for (i = numsectors; i > 0; ++lights, --i)
	{
		arc << *lights;
	}
}